

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O2

int IpmiFruEncodeDynamic
              (void *buffer,uint offset,size_t size,uint16_t instance_id,int *piece_offset)

{
  size_t __n;
  bool bVar1;
  
  __n = size - (long)*piece_offset;
  bVar1 = __n < 0xf9;
  if (0xf7 < __n) {
    __n = 0xf8;
  }
  multirecord.data._0_2_ = instance_id;
  memcpy(multirecord.data + 2,(void *)((long)buffer + (long)*piece_offset + (ulong)offset),__n);
  IpmiFillPICMGHeader('7',__n + 2);
  *piece_offset = *piece_offset + (int)__n;
  return (int)bVar1;
}

Assistant:

BOOL IpmiFruEncodeDynamic(void *buffer, unsigned int offset, size_t size, uint16_t instance_id, int *piece_offset)
{
    const int MAX_PIECE_SIZE = IPMI_FRUINFO_MAX_MULTIRECORD_SIZE - 
                            sizeof(ipmi_fru_picmg_dynamic_eeep_record_header_t);
    size_t piece_size = size - (*piece_offset);
    BOOL last_piece = TRUE;
    if (piece_size > MAX_PIECE_SIZE) {
        piece_size = MAX_PIECE_SIZE;
        last_piece = FALSE;
    }
    multirecord.data[0] = instance_id & 0xFF;
    multirecord.data[1] = (instance_id >> 8) & 0xFF;
    memcpy(multirecord.data + 2, (uint8_t *)buffer + offset + (*piece_offset), piece_size);
    IpmiFillPICMGHeader(PICMG_RECORD_ID_EEEP_DYNAMIC_BLOCK, piece_size + 2);
    (*piece_offset) += piece_size;
    return last_piece;
}